

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheVk.cpp
# Opt level: O1

void __thiscall
Diligent::ShaderResourceCacheVk::Resource::SetStorageBuffer
          (Resource *this,RefCntAutoPtr<Diligent::IDeviceObject> *_pBufferView)

{
  BUFFER_VIEW_TYPE BVar1;
  IBuffer *pSrcPtr;
  BufferViewVkImpl *pBVar2;
  char (*in_RCX) [193];
  char (*in_R8) [96];
  char **in_R9;
  BufferViewDesc *Args;
  string msg;
  string local_48;
  Char *local_28;
  
  if (3 < (byte)(this->Type - StorageBuffer)) {
    FormatString<char[26],char[193]>
              (&local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "Type == DescriptorType::StorageBuffer || Type == DescriptorType::StorageBufferDynamic || Type == DescriptorType::StorageBuffer_ReadOnly || Type == DescriptorType::StorageBufferDynamic_ReadOnly"
               ,in_RCX);
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"SetStorageBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
               ,0xed);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  RefCntAutoPtr<Diligent::IDeviceObject>::operator=(&this->pObject,_pBufferView);
  this->BufferDynamicOffset = 0;
  this->BufferBaseOffset = 0;
  this->BufferRangeSize = 0;
  if ((this->pObject).m_pObject == (IDeviceObject *)0x0) {
    return;
  }
  pBVar2 = RefCntAutoPtr<Diligent::IDeviceObject>::ConstPtr<Diligent::BufferViewVkImpl>
                     (&this->pObject);
  this->BufferBaseOffset =
       (pBVar2->super_BufferViewBase<Diligent::EngineVkImplTraits>).
       super_DeviceObjectBase<Diligent::IBufferViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferViewDesc>
       .m_Desc.ByteOffset;
  this->BufferRangeSize =
       (pBVar2->super_BufferViewBase<Diligent::EngineVkImplTraits>).
       super_DeviceObjectBase<Diligent::IBufferViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferViewDesc>
       .m_Desc.ByteWidth;
  pSrcPtr = (pBVar2->super_BufferViewBase<Diligent::EngineVkImplTraits>).m_pBuffer;
  if (pSrcPtr != (IBuffer *)0x0) {
    CheckDynamicType<Diligent::BufferVkImpl_const,Diligent::IBuffer>(pSrcPtr);
  }
  if (((byte)(this->Type - InputAttachment) < 0xfe) &&
     (*(char *)((long)&pSrcPtr[5].super_IDeviceObject.super_IObject._vptr_IObject + 4) == '\x02')) {
    FormatString<char[98]>
              (&local_48,
               (char (*) [98])
               "Dynamic buffer must be used with StorageBufferDynamic or StorageBufferDynamic_ReadOnly descriptor"
              );
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"SetStorageBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
               ,0x103);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  if (pSrcPtr[4].super_IDeviceObject.super_IObject._vptr_IObject <
      (_func_int **)(this->BufferRangeSize + this->BufferBaseOffset)) {
    FormatString<char[45]>(&local_48,(char (*) [45])"Specified view range is out of buffer bounds");
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"SetStorageBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
               ,0x106);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  if (this->Type - 9 < 4) {
    Args = &(pBVar2->super_BufferViewBase<Diligent::EngineVkImplTraits>).
            super_DeviceObjectBase<Diligent::IBufferViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferViewDesc>
            .m_Desc;
    switch((uint)this->Type) {
    default:
      BVar1 = (pBVar2->super_BufferViewBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::IBufferViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferViewDesc>
              .m_Desc.ViewType;
      if (BVar1 != BUFFER_VIEW_UNORDERED_ACCESS) {
        local_28 = GetBufferViewTypeLiteralName(BVar1);
        in_R8 = (char (*) [96])&local_28;
        FormatString<char[33],char_const*,char[96],char_const*>
                  (&local_48,(Diligent *)"Attempting to bind buffer view \'",(char (*) [33])Args,
                   (char **)
                   "\' as writable storage buffer. Expected view type is BUFFER_VIEW_UNORDERED_ACCESS. Actual type: "
                   ,in_R8,in_R9);
        DebugAssertionFailed
                  (local_48._M_dataplus._M_p,"SetStorageBuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
                   ,0x117);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        }
      }
      if (((ulong)pSrcPtr[5].super_IDeviceObject.super_IObject._vptr_IObject & 0x80) != 0) {
        return;
      }
      FormatString<char[9],char_const*,char[87]>
                (&local_48,(Diligent *)0x8239f8,(char (*) [9])(pSrcPtr + 3),
                 (char **)
                 "\' being set as writable storage buffer was not created with BIND_UNORDERED_ACCESS flag"
                 ,(char (*) [87])in_R8);
      DebugAssertionFailed
                (local_48._M_dataplus._M_p,"SetStorageBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
                 ,0x119);
      break;
    case 10:
    case 0xc:
      BVar1 = (pBVar2->super_BufferViewBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::IBufferViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferViewDesc>
              .m_Desc.ViewType;
      if (BVar1 != BUFFER_VIEW_SHADER_RESOURCE) {
        local_28 = GetBufferViewTypeLiteralName(BVar1);
        in_R8 = (char (*) [96])&local_28;
        FormatString<char[33],char_const*,char[96],char_const*>
                  (&local_48,(Diligent *)"Attempting to bind buffer view \'",(char (*) [33])Args,
                   (char **)
                   "\' as read-only storage buffer. Expected view type is BUFFER_VIEW_SHADER_RESOURCE. Actual type: "
                   ,in_R8,in_R9);
        DebugAssertionFailed
                  (local_48._M_dataplus._M_p,"SetStorageBuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
                   ,0x10f);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        }
      }
      if (((ulong)pSrcPtr[5].super_IDeviceObject.super_IObject._vptr_IObject & 8) != 0) {
        return;
      }
      FormatString<char[9],char_const*,char[87]>
                (&local_48,(Diligent *)0x8239f8,(char (*) [9])(pSrcPtr + 3),
                 (char **)
                 "\' being set as read-only storage buffer was not created with BIND_SHADER_RESOURCE flag"
                 ,(char (*) [87])in_R8);
      DebugAssertionFailed
                (local_48._M_dataplus._M_p,"SetStorageBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
                 ,0x111);
    }
  }
  else {
    FormatString<char[25]>(&local_48,(char (*) [25])"Unexpected resource type");
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"SetStorageBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
               ,0x11d);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ShaderResourceCacheVk::Resource::SetStorageBuffer(RefCntAutoPtr<IDeviceObject>&& _pBufferView)
{
    VERIFY_EXPR(Type == DescriptorType::StorageBuffer ||
                Type == DescriptorType::StorageBufferDynamic ||
                Type == DescriptorType::StorageBuffer_ReadOnly ||
                Type == DescriptorType::StorageBufferDynamic_ReadOnly);

    pObject = std::move(_pBufferView);

    BufferDynamicOffset = 0; // It is essential to reset dynamic offset
    BufferBaseOffset    = 0;
    BufferRangeSize     = 0;

    if (!pObject)
        return;

    const BufferViewVkImpl* pBuffViewVk = pObject.ConstPtr<BufferViewVkImpl>();
    const BufferViewDesc&   ViewDesc    = pBuffViewVk->GetDesc();

    BufferBaseOffset = ViewDesc.ByteOffset;
    BufferRangeSize  = ViewDesc.ByteWidth;

#ifdef DILIGENT_DEBUG
    {
        const BufferVkImpl* pBuffVk  = pBuffViewVk->GetBuffer<const BufferVkImpl>();
        const BufferDesc&   BuffDesc = pBuffVk->GetDesc();
        VERIFY(Type == DescriptorType::StorageBufferDynamic || Type == DescriptorType::StorageBufferDynamic_ReadOnly || BuffDesc.Usage != USAGE_DYNAMIC,
               "Dynamic buffer must be used with StorageBufferDynamic or StorageBufferDynamic_ReadOnly descriptor");

        VERIFY(BufferBaseOffset + BufferRangeSize <= BuffDesc.Size,
               "Specified view range is out of buffer bounds");

        // VK_DESCRIPTOR_TYPE_STORAGE_BUFFER or VK_DESCRIPTOR_TYPE_STORAGE_BUFFER_DYNAMIC descriptor type
        // require buffer to be created with VK_BUFFER_USAGE_STORAGE_BUFFER_BIT (13.2.4)
        if (Type == DescriptorType::StorageBuffer_ReadOnly || Type == DescriptorType::StorageBufferDynamic_ReadOnly)
        {
            // HLSL buffer SRVs are mapped to read-only storage buffers in SPIR-V
            VERIFY(ViewDesc.ViewType == BUFFER_VIEW_SHADER_RESOURCE, "Attempting to bind buffer view '", ViewDesc.Name,
                   "' as read-only storage buffer. Expected view type is BUFFER_VIEW_SHADER_RESOURCE. Actual type: ",
                   GetBufferViewTypeLiteralName(ViewDesc.ViewType));
            VERIFY((BuffDesc.BindFlags & BIND_SHADER_RESOURCE) != 0,
                   "Buffer '", BuffDesc.Name, "' being set as read-only storage buffer was not created with BIND_SHADER_RESOURCE flag");
        }
        else if (Type == DescriptorType::StorageBuffer || Type == DescriptorType::StorageBufferDynamic)
        {
            VERIFY(ViewDesc.ViewType == BUFFER_VIEW_UNORDERED_ACCESS, "Attempting to bind buffer view '", ViewDesc.Name,
                   "' as writable storage buffer. Expected view type is BUFFER_VIEW_UNORDERED_ACCESS. Actual type: ",
                   GetBufferViewTypeLiteralName(ViewDesc.ViewType));
            VERIFY((BuffDesc.BindFlags & BIND_UNORDERED_ACCESS) != 0,
                   "Buffer '", BuffDesc.Name, "' being set as writable storage buffer was not created with BIND_UNORDERED_ACCESS flag");
        }
        else
        {
            UNEXPECTED("Unexpected resource type");
        }
    }
#endif
}